

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void C_ArchiveCVars(FConfigFile *f,uint32 filter)

{
  FBaseCVar *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  FBaseCVar **ppFVar3;
  
  ppFVar3 = &CVars;
  while (pFVar1 = *ppFVar3, pFVar1 != (FBaseCVar *)0x0) {
    if ((pFVar1->Flags & 0x3507) == filter) {
      iVar2 = (*pFVar1->_vptr_FBaseCVar[4])(pFVar1,3);
      FConfigFile::SetValueForKey(f,pFVar1->Name,(char *)CONCAT44(extraout_var,iVar2),false);
    }
    ppFVar3 = &pFVar1->m_Next;
  }
  return;
}

Assistant:

void C_ArchiveCVars (FConfigFile *f, uint32 filter)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if ((cvar->Flags &
			(CVAR_GLOBALCONFIG|CVAR_ARCHIVE|CVAR_MOD|CVAR_AUTO|CVAR_USERINFO|CVAR_SERVERINFO|CVAR_NOSAVE))
			== filter)
		{
			UCVarValue val;
			val = cvar->GetGenericRep (CVAR_String);
			f->SetValueForKey (cvar->GetName (), val.String);
		}
		cvar = cvar->m_Next;
	}
}